

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type time_plain<trng::count128_lcg_shift>(count128_lcg_shift *r)

{
  result_type *prVar1;
  uint uVar2;
  uint uVar4;
  undefined1 auVar3 [16];
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  string res;
  string local_68;
  long local_48;
  long lStack_40;
  double local_38;
  
  lVar8 = std::chrono::_V2::system_clock::now();
  uVar5 = (ulong)(r->P).increment.value;
  lVar9 = *(long *)((long)&(r->P).increment.value + 8);
  lVar14 = *(long *)((long)&(r->S).r.value + 8);
  uVar13 = (ulong)(r->S).r.value;
  auVar3 = *(undefined1 (*) [16])&(r->P).b;
  bVar20 = CARRY8(uVar5 * 0x1000000,uVar13);
  lVar10 = uVar5 * 0x1000000 + uVar13;
  lVar6 = (lVar9 << 0x18 | uVar5 >> 0x28) + lVar14;
  uVar15 = uVar13 + uVar5;
  lVar16 = lVar14 + lVar9 + (ulong)CARRY8(uVar13,uVar5);
  uVar17 = lVar9 << 1 | uVar5 >> 0x3f;
  uVar7 = uVar5 * 2;
  prVar1 = &(r->P).a;
  uVar2 = (uint)*prVar1;
  uVar4 = *(uint *)((long)&(r->P).a + 4);
  auVar22._8_4_ = uVar2;
  auVar22._0_8_ = *prVar1;
  auVar22._12_4_ = uVar4;
  auVar23._0_8_ = auVar3._0_8_;
  auVar23._8_4_ = auVar3._0_4_;
  auVar23._12_4_ = auVar3._4_4_;
  local_48 = 0;
  lStack_40 = 0;
  uVar18 = 0;
  lVar19 = 0;
  do {
    uVar12 = lVar9 + lVar16 + (ulong)CARRY8(uVar5,uVar15) ^ uVar5 + uVar15;
    uVar11 = lVar9 + lVar14 + (ulong)CARRY8(uVar5,uVar13) ^ uVar5 + uVar13;
    uVar11 = (ulong)uVar2 * (uVar11 & 0xffffffff) + auVar23._0_8_ +
             ((uVar11 >> 0x20) * (ulong)uVar2 + (ulong)uVar4 * (uVar11 & 0xffffffff) << 0x20);
    uVar12 = (auVar22._8_8_ & 0xffffffff) * (uVar12 & 0xffffffff) + auVar23._8_8_ +
             ((uVar12 >> 0x20) * (ulong)uVar2 + (auVar22._8_8_ >> 0x20) * (uVar12 & 0xffffffff) <<
             0x20);
    uVar11 = uVar11 >> 0x17 ^ uVar11;
    uVar12 = uVar12 >> 0x17 ^ uVar12;
    uVar11 = uVar11 << 0x29 ^ uVar11;
    uVar12 = uVar12 << 0x29 ^ uVar12;
    bVar21 = 0xfffffffffffffffd < uVar18;
    uVar18 = uVar18 + 2;
    lVar19 = lVar19 + (ulong)bVar21;
    local_48 = local_48 + (uVar11 >> 0x12 ^ uVar11);
    lStack_40 = lStack_40 + (uVar12 >> 0x12 ^ uVar12);
    bVar21 = CARRY8(uVar13,uVar7);
    uVar13 = uVar13 + uVar7;
    lVar14 = lVar14 + uVar17 + (ulong)bVar21;
    bVar21 = CARRY8(uVar15,uVar7);
    uVar15 = uVar15 + uVar7;
    lVar16 = lVar16 + uVar17 + (ulong)bVar21;
  } while (uVar18 != 0x1000000 || lVar19 != 0);
  *(long *)&(r->S).r.value = lVar10;
  *(ulong *)((long)&(r->S).r.value + 8) = lVar6 + (ulong)bVar20;
  lVar9 = std::chrono::_V2::system_clock::now();
  local_38 = 16.777216 / ((double)((lVar9 - lVar8) / 1000) * 1e-06);
  to_string<double>(&local_68,&local_38);
  while (local_68._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_68);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return lStack_40 + local_48;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}